

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O2

int pool_bulk_lookup(StringPool *pool,xmlHashTablePtr hash,size_t num,int existing)

{
  ulong uVar1;
  char *pcVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  xmlChar **ppxVar10;
  int local_94;
  xmlChar *prefix [3];
  undefined8 local_48 [3];
  
  uVar5 = pool->index;
  uVar6 = 0;
  local_94 = 0;
LAB_0010369c:
  if ((pool->num_strings <= uVar5) || (num <= uVar6)) {
    pool->index = uVar5;
    return local_94;
  }
  ppxVar10 = pool->strings + uVar5;
  iVar9 = 0;
  do {
    uVar1 = pool->num_keys;
    if (iVar9 == 0) {
      if (uVar1 == 3) {
        pxVar3 = (xmlChar *)xmlHashLookup3(hash,*ppxVar10,ppxVar10[1],ppxVar10[2]);
      }
      else if (uVar1 == 2) {
        pxVar3 = (xmlChar *)xmlHashLookup2(hash,*ppxVar10,ppxVar10[1]);
      }
      else if (uVar1 == 1) {
        pxVar3 = (xmlChar *)xmlHashLookup(hash,*ppxVar10);
      }
      else {
        pxVar3 = (xmlChar *)0x0;
      }
    }
    else {
      if (iVar9 == 2) break;
      for (uVar7 = 0; uVar7 != 3; uVar7 = uVar7 + 1) {
        if (uVar7 < uVar1) {
          pxVar3 = ppxVar10[uVar7];
          pcVar2 = strchr((char *)pxVar3,0x3a);
          if (pcVar2 == (char *)0x0) {
            prefix[uVar7] = (xmlChar *)0x0;
          }
          else {
            pxVar3 = (xmlChar *)xmlStrndup(pxVar3,(int)pcVar2 - (int)pxVar3);
            prefix[uVar7] = pxVar3;
            pxVar3 = (xmlChar *)(pcVar2 + 1);
          }
        }
        else {
          prefix[uVar7] = (xmlChar *)0x0;
          pxVar3 = (xmlChar *)0x0;
        }
        local_48[uVar7] = pxVar3;
      }
      pxVar3 = (xmlChar *)
               xmlHashQLookup3(hash,prefix[0],local_48[0],prefix[1],local_48[1],prefix[2],
                               local_48[2]);
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        (*_xmlFree)(prefix[lVar8]);
      }
    }
    if (existing == 0) {
      pxVar4 = (xmlChar *)0x0;
    }
    else {
      pxVar4 = *ppxVar10;
    }
    if (pxVar3 != pxVar4) {
      local_94 = -1;
    }
    iVar9 = iVar9 + 1;
  } while( true );
  uVar5 = uVar5 + uVar1;
  uVar6 = uVar6 + 1;
  goto LAB_0010369c;
}

Assistant:

static int
pool_bulk_lookup(StringPool *pool, xmlHashTablePtr hash, size_t num,
                 int existing) {
    size_t i, j;
    int ret = 0;

    for (i = pool->index, j = 0; i < pool->num_strings && j < num; j++) {
        xmlChar **str = &pool->strings[i];
        int q;

        for (q = 0; q < 2; q++) {
            xmlChar *res = NULL;

            if (q) {
                res = hash_qlookup(hash, str, pool->num_keys);
            } else {
                switch (pool->num_keys) {
                    case 1:
                        res = xmlHashLookup(hash, str[0]);
                        break;
                    case 2:
                        res = xmlHashLookup2(hash, str[0], str[1]);
                        break;
                    case 3:
                        res = xmlHashLookup3(hash, str[0], str[1], str[2]);
                        break;
                }
            }

            if (existing) {
                if (res != str[0])
                    ret = -1;
            } else {
                if (res != NULL)
                    ret = -1;
            }
        }

        i += pool->num_keys;
    }

    pool->index = i;
    return ret;
}